

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  int iVar7;
  AABBNodeMB4D *node1;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  Geometry *pGVar12;
  ulong uVar13;
  ulong *puVar14;
  Scene *pSVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  float fVar66;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar74;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar86 [16];
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_bf9;
  ulong *local_bf8;
  long local_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined8 local_b80;
  float fStack_b78;
  float fStack_b74;
  undefined1 local_b70 [16];
  undefined1 local_b60 [16];
  long local_b48;
  long local_b40;
  ulong local_b38;
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [32];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [16];
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 *local_9c0;
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_a30._4_4_ = uVar1;
  local_a30._0_4_ = uVar1;
  local_a30._8_4_ = uVar1;
  local_a30._12_4_ = uVar1;
  auVar57 = ZEXT1664(local_a30);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_a40._4_4_ = uVar1;
  local_a40._0_4_ = uVar1;
  local_a40._8_4_ = uVar1;
  local_a40._12_4_ = uVar1;
  auVar64 = ZEXT1664(local_a40);
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_a50._4_4_ = uVar1;
  local_a50._0_4_ = uVar1;
  local_a50._8_4_ = uVar1;
  local_a50._12_4_ = uVar1;
  auVar65 = ZEXT1664(local_a50);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar90 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar94 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar66 = fVar85 * 0.99999964;
  fVar74 = fVar90 * 0.99999964;
  fVar81 = fVar94 * 0.99999964;
  fVar85 = fVar85 * 1.0000004;
  fVar90 = fVar90 * 1.0000004;
  fVar94 = fVar94 * 1.0000004;
  uVar16 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_b38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar11 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar19 = uVar16 ^ 0x10;
  uVar17 = local_b38 ^ 0x10;
  iVar7 = (tray->tnear).field_0.i[k];
  local_ac0._4_4_ = iVar7;
  local_ac0._0_4_ = iVar7;
  local_ac0._8_4_ = iVar7;
  local_ac0._12_4_ = iVar7;
  auVar101 = ZEXT1664(local_ac0);
  iVar7 = (tray->tfar).field_0.i[k];
  local_ad0._4_4_ = iVar7;
  local_ad0._0_4_ = iVar7;
  local_ad0._8_4_ = iVar7;
  local_ad0._12_4_ = iVar7;
  auVar102 = ZEXT1664(local_ad0);
  iVar7 = 1 << ((uint)k & 0x1f);
  auVar26._4_4_ = iVar7;
  auVar26._0_4_ = iVar7;
  auVar26._8_4_ = iVar7;
  auVar26._12_4_ = iVar7;
  auVar26._16_4_ = iVar7;
  auVar26._20_4_ = iVar7;
  auVar26._24_4_ = iVar7;
  auVar26._28_4_ = iVar7;
  auVar5 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar26 = vpand_avx2(auVar26,auVar5);
  local_940 = vpcmpeqd_avx2(auVar26,auVar5);
  local_bf8 = local_7f8;
  fVar71 = fVar66;
  fVar72 = fVar66;
  fVar73 = fVar66;
  fVar78 = fVar74;
  fVar79 = fVar74;
  fVar80 = fVar74;
  fVar82 = fVar81;
  fVar83 = fVar81;
  fVar84 = fVar81;
  fVar87 = fVar85;
  fVar88 = fVar85;
  fVar89 = fVar85;
  fVar91 = fVar90;
  fVar92 = fVar90;
  fVar93 = fVar90;
  fVar97 = fVar94;
  fVar98 = fVar94;
  fVar99 = fVar94;
  local_ab0 = fVar94;
  fStack_aac = fVar94;
  fStack_aa8 = fVar94;
  fStack_aa4 = fVar94;
  local_aa0 = fVar90;
  fStack_a9c = fVar90;
  fStack_a98 = fVar90;
  fStack_a94 = fVar90;
  local_a90 = fVar85;
  fStack_a8c = fVar85;
  fStack_a88 = fVar85;
  fStack_a84 = fVar85;
  local_a80 = fVar81;
  fStack_a7c = fVar81;
  fStack_a78 = fVar81;
  fStack_a74 = fVar81;
  local_a70 = fVar74;
  fStack_a6c = fVar74;
  fStack_a68 = fVar74;
  fStack_a64 = fVar74;
  local_a60 = fVar66;
  fStack_a5c = fVar66;
  fStack_a58 = fVar66;
  fStack_a54 = fVar66;
LAB_015f1833:
  do {
    puVar14 = local_bf8;
    if (puVar14 == &local_800) {
LAB_015f2271:
      return puVar14 != &local_800;
    }
    local_bf8 = puVar14 + -1;
    uVar18 = puVar14[-1];
    while ((uVar18 & 8) == 0) {
      uVar8 = uVar18 & 0xfffffffffffffff0;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar20._4_4_ = uVar1;
      auVar20._0_4_ = uVar1;
      auVar20._8_4_ = uVar1;
      auVar20._12_4_ = uVar1;
      auVar21 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar8 + 0x80 + uVar16),auVar20,
                                *(undefined1 (*) [16])(uVar8 + 0x20 + uVar16));
      auVar21 = vsubps_avx(auVar21,auVar57._0_16_);
      auVar27._0_4_ = fVar66 * auVar21._0_4_;
      auVar27._4_4_ = fVar71 * auVar21._4_4_;
      auVar27._8_4_ = fVar72 * auVar21._8_4_;
      auVar27._12_4_ = fVar73 * auVar21._12_4_;
      auVar21 = vmaxps_avx(auVar101._0_16_,auVar27);
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar8 + 0x80 + local_b38),auVar20,
                                *(undefined1 (*) [16])(uVar8 + 0x20 + local_b38));
      auVar27 = vsubps_avx(auVar27,auVar64._0_16_);
      auVar33._0_4_ = fVar74 * auVar27._0_4_;
      auVar33._4_4_ = fVar78 * auVar27._4_4_;
      auVar33._8_4_ = fVar79 * auVar27._8_4_;
      auVar33._12_4_ = fVar80 * auVar27._12_4_;
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar8 + 0x80 + uVar11),auVar20,
                                *(undefined1 (*) [16])(uVar8 + 0x20 + uVar11));
      auVar27 = vsubps_avx(auVar27,auVar65._0_16_);
      auVar40._0_4_ = fVar81 * auVar27._0_4_;
      auVar40._4_4_ = fVar82 * auVar27._4_4_;
      auVar40._8_4_ = fVar83 * auVar27._8_4_;
      auVar40._12_4_ = fVar84 * auVar27._12_4_;
      auVar27 = vmaxps_avx(auVar33,auVar40);
      auVar21 = vmaxps_avx(auVar21,auVar27);
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar8 + 0x80 + uVar19),auVar20,
                                *(undefined1 (*) [16])(uVar8 + 0x20 + uVar19));
      auVar27 = vsubps_avx(auVar27,auVar57._0_16_);
      auVar34._0_4_ = fVar85 * auVar27._0_4_;
      auVar34._4_4_ = fVar87 * auVar27._4_4_;
      auVar34._8_4_ = fVar88 * auVar27._8_4_;
      auVar34._12_4_ = fVar89 * auVar27._12_4_;
      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar8 + 0x80 + uVar17),auVar20,
                                *(undefined1 (*) [16])(uVar8 + 0x20 + uVar17));
      auVar27 = vminps_avx(auVar102._0_16_,auVar34);
      auVar33 = vsubps_avx(auVar33,auVar64._0_16_);
      auVar41._0_4_ = fVar90 * auVar33._0_4_;
      auVar41._4_4_ = fVar91 * auVar33._4_4_;
      auVar41._8_4_ = fVar92 * auVar33._8_4_;
      auVar41._12_4_ = fVar93 * auVar33._12_4_;
      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar8 + 0x80 + (uVar11 ^ 0x10)),auVar20,
                                *(undefined1 (*) [16])(uVar8 + 0x20 + (uVar11 ^ 0x10)));
      auVar33 = vsubps_avx(auVar33,auVar65._0_16_);
      auVar45._0_4_ = fVar94 * auVar33._0_4_;
      auVar45._4_4_ = fVar97 * auVar33._4_4_;
      auVar45._8_4_ = fVar98 * auVar33._8_4_;
      auVar45._12_4_ = fVar99 * auVar33._12_4_;
      auVar33 = vminps_avx(auVar41,auVar45);
      auVar27 = vminps_avx(auVar27,auVar33);
      if (((uint)uVar18 & 7) == 6) {
        auVar27 = vcmpps_avx(auVar21,auVar27,2);
        auVar21 = vcmpps_avx(*(undefined1 (*) [16])(uVar8 + 0xe0),auVar20,2);
        auVar33 = vcmpps_avx(auVar20,*(undefined1 (*) [16])(uVar8 + 0xf0),1);
        auVar21 = vandps_avx(auVar21,auVar33);
        auVar21 = vandps_avx(auVar21,auVar27);
      }
      else {
        auVar21 = vcmpps_avx(auVar21,auVar27,2);
      }
      auVar21 = vpslld_avx(auVar21,0x1f);
      uVar9 = vmovmskps_avx(auVar21);
      if (uVar9 == 0) goto LAB_015f1833;
      uVar9 = uVar9 & 0xff;
      lVar10 = 0;
      for (uVar18 = (ulong)uVar9; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
        lVar10 = lVar10 + 1;
      }
      uVar18 = *(ulong *)(uVar8 + lVar10 * 8);
      uVar9 = uVar9 - 1 & uVar9;
      uVar13 = (ulong)uVar9;
      if (uVar9 != 0) {
        do {
          *local_bf8 = uVar18;
          local_bf8 = local_bf8 + 1;
          lVar10 = 0;
          for (uVar18 = uVar13; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
            lVar10 = lVar10 + 1;
          }
          uVar13 = uVar13 - 1 & uVar13;
          uVar18 = *(ulong *)(uVar8 + lVar10 * 8);
        } while (uVar13 != 0);
      }
    }
    local_b40 = (ulong)((uint)uVar18 & 0xf) - 8;
    uVar18 = uVar18 & 0xfffffffffffffff0;
    for (local_b48 = 0; local_b48 != local_b40; local_b48 = local_b48 + 1) {
      lVar10 = local_b48 * 0x140;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar46._4_4_ = uVar1;
      auVar46._0_4_ = uVar1;
      auVar46._8_4_ = uVar1;
      auVar46._12_4_ = uVar1;
      auVar21 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x90 + lVar10),auVar46,
                                *(undefined1 (*) [16])(uVar18 + lVar10));
      auVar27 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0xa0 + lVar10),auVar46,
                                *(undefined1 (*) [16])(uVar18 + 0x10 + lVar10));
      auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0xb0 + lVar10),auVar46,
                                *(undefined1 (*) [16])(uVar18 + 0x20 + lVar10));
      auVar20 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0xc0 + lVar10),auVar46,
                                *(undefined1 (*) [16])(uVar18 + 0x30 + lVar10));
      auVar34 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0xd0 + lVar10),auVar46,
                                *(undefined1 (*) [16])(uVar18 + 0x40 + lVar10));
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0xe0 + lVar10),auVar46,
                                *(undefined1 (*) [16])(uVar18 + 0x50 + lVar10));
      auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0xf0 + lVar10),auVar46,
                                *(undefined1 (*) [16])(uVar18 + 0x60 + lVar10));
      auVar45 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x100 + lVar10),auVar46,
                                *(undefined1 (*) [16])(uVar18 + 0x70 + lVar10));
      auVar22 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar18 + 0x110 + lVar10),auVar46,
                                *(undefined1 (*) [16])(uVar18 + 0x80 + lVar10));
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar47._4_4_ = uVar1;
      auVar47._0_4_ = uVar1;
      auVar47._8_4_ = uVar1;
      auVar47._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar95._4_4_ = uVar1;
      auVar95._0_4_ = uVar1;
      auVar95._8_4_ = uVar1;
      auVar95._12_4_ = uVar1;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar100._4_4_ = uVar1;
      auVar100._0_4_ = uVar1;
      auVar100._8_4_ = uVar1;
      auVar100._12_4_ = uVar1;
      local_b60 = vsubps_avx(auVar21,auVar47);
      local_b70 = vsubps_avx(auVar27,auVar95);
      local_b90 = vsubps_avx(auVar33,auVar100);
      auVar21 = vsubps_avx(auVar20,auVar47);
      auVar27 = vsubps_avx(auVar34,auVar95);
      auVar33 = vsubps_avx(auVar40,auVar100);
      auVar20 = vsubps_avx(auVar41,auVar47);
      auVar34 = vsubps_avx(auVar45,auVar95);
      auVar40 = vsubps_avx(auVar22,auVar100);
      local_ba0 = vsubps_avx(auVar20,local_b60);
      local_bc0 = vsubps_avx(auVar34,local_b70);
      local_bb0 = vsubps_avx(auVar40,local_b90);
      auVar22._0_4_ = auVar20._0_4_ + local_b60._0_4_;
      auVar22._4_4_ = auVar20._4_4_ + local_b60._4_4_;
      auVar22._8_4_ = auVar20._8_4_ + local_b60._8_4_;
      auVar22._12_4_ = auVar20._12_4_ + local_b60._12_4_;
      auVar42._0_4_ = auVar34._0_4_ + local_b70._0_4_;
      auVar42._4_4_ = auVar34._4_4_ + local_b70._4_4_;
      auVar42._8_4_ = auVar34._8_4_ + local_b70._8_4_;
      auVar42._12_4_ = auVar34._12_4_ + local_b70._12_4_;
      fVar85 = local_b90._0_4_;
      auVar48._0_4_ = auVar40._0_4_ + fVar85;
      fVar90 = local_b90._4_4_;
      auVar48._4_4_ = auVar40._4_4_ + fVar90;
      fVar94 = local_b90._8_4_;
      auVar48._8_4_ = auVar40._8_4_ + fVar94;
      fVar66 = local_b90._12_4_;
      auVar48._12_4_ = auVar40._12_4_ + fVar66;
      auVar96._0_4_ = local_bb0._0_4_ * auVar42._0_4_;
      auVar96._4_4_ = local_bb0._4_4_ * auVar42._4_4_;
      auVar96._8_4_ = local_bb0._8_4_ * auVar42._8_4_;
      auVar96._12_4_ = local_bb0._12_4_ * auVar42._12_4_;
      auVar45 = vfmsub231ps_fma(auVar96,local_bc0,auVar48);
      auVar49._0_4_ = auVar48._0_4_ * local_ba0._0_4_;
      auVar49._4_4_ = auVar48._4_4_ * local_ba0._4_4_;
      auVar49._8_4_ = auVar48._8_4_ * local_ba0._8_4_;
      auVar49._12_4_ = auVar48._12_4_ * local_ba0._12_4_;
      auVar41 = vfmsub231ps_fma(auVar49,local_bb0,auVar22);
      auVar23._0_4_ = local_bc0._0_4_ * auVar22._0_4_;
      auVar23._4_4_ = local_bc0._4_4_ * auVar22._4_4_;
      auVar23._8_4_ = local_bc0._8_4_ * auVar22._8_4_;
      auVar23._12_4_ = local_bc0._12_4_ * auVar22._12_4_;
      auVar22 = vfmsub231ps_fma(auVar23,local_ba0,auVar42);
      local_b80._4_4_ = *(float *)(ray + k * 4 + 0xc0);
      auVar75._0_4_ = auVar22._0_4_ * local_b80._4_4_;
      auVar75._4_4_ = auVar22._4_4_ * local_b80._4_4_;
      auVar75._8_4_ = auVar22._8_4_ * local_b80._4_4_;
      auVar75._12_4_ = auVar22._12_4_ * local_b80._4_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0xa0);
      auVar86._4_4_ = uVar1;
      auVar86._0_4_ = uVar1;
      auVar86._8_4_ = uVar1;
      auVar86._12_4_ = uVar1;
      auVar41 = vfmadd231ps_fma(auVar75,auVar86,auVar41);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      local_be0._4_4_ = uVar1;
      local_be0._0_4_ = uVar1;
      local_be0._8_4_ = uVar1;
      local_be0._12_4_ = uVar1;
      local_a10 = vfmadd231ps_fma(auVar41,local_be0,auVar45);
      auVar41 = vsubps_avx(local_b70,auVar27);
      local_a00 = vsubps_avx(local_b90,auVar33);
      auVar43._0_4_ = local_b70._0_4_ + auVar27._0_4_;
      auVar43._4_4_ = local_b70._4_4_ + auVar27._4_4_;
      auVar43._8_4_ = local_b70._8_4_ + auVar27._8_4_;
      auVar43._12_4_ = local_b70._12_4_ + auVar27._12_4_;
      auVar50._0_4_ = fVar85 + auVar33._0_4_;
      auVar50._4_4_ = fVar90 + auVar33._4_4_;
      auVar50._8_4_ = fVar94 + auVar33._8_4_;
      auVar50._12_4_ = fVar66 + auVar33._12_4_;
      fVar74 = local_a00._0_4_;
      auVar58._0_4_ = auVar43._0_4_ * fVar74;
      fVar72 = local_a00._4_4_;
      auVar58._4_4_ = auVar43._4_4_ * fVar72;
      fVar79 = local_a00._8_4_;
      auVar58._8_4_ = auVar43._8_4_ * fVar79;
      fVar83 = local_a00._12_4_;
      auVar58._12_4_ = auVar43._12_4_ * fVar83;
      auVar23 = vfmsub231ps_fma(auVar58,auVar41,auVar50);
      auVar45 = vsubps_avx(local_b60,auVar21);
      fVar81 = auVar45._0_4_;
      auVar51._0_4_ = auVar50._0_4_ * fVar81;
      fVar73 = auVar45._4_4_;
      auVar51._4_4_ = auVar50._4_4_ * fVar73;
      fVar80 = auVar45._8_4_;
      auVar51._8_4_ = auVar50._8_4_ * fVar80;
      fVar84 = auVar45._12_4_;
      auVar51._12_4_ = auVar50._12_4_ * fVar84;
      auVar67._0_4_ = local_b60._0_4_ + auVar21._0_4_;
      auVar67._4_4_ = local_b60._4_4_ + auVar21._4_4_;
      auVar67._8_4_ = local_b60._8_4_ + auVar21._8_4_;
      auVar67._12_4_ = local_b60._12_4_ + auVar21._12_4_;
      auVar22 = vfmsub231ps_fma(auVar51,local_a00,auVar67);
      fVar71 = auVar41._0_4_;
      auVar68._0_4_ = auVar67._0_4_ * fVar71;
      fVar78 = auVar41._4_4_;
      auVar68._4_4_ = auVar67._4_4_ * fVar78;
      fVar82 = auVar41._8_4_;
      auVar68._8_4_ = auVar67._8_4_ * fVar82;
      fVar87 = auVar41._12_4_;
      auVar68._12_4_ = auVar67._12_4_ * fVar87;
      auVar28 = vfmsub231ps_fma(auVar68,auVar45,auVar43);
      auVar44._0_4_ = auVar28._0_4_ * local_b80._4_4_;
      auVar44._4_4_ = auVar28._4_4_ * local_b80._4_4_;
      auVar44._8_4_ = auVar28._8_4_ * local_b80._4_4_;
      auVar44._12_4_ = auVar28._12_4_ * local_b80._4_4_;
      auVar22 = vfmadd231ps_fma(auVar44,auVar86,auVar22);
      local_9e0 = vfmadd231ps_fma(auVar22,local_be0,auVar23);
      auVar22 = vsubps_avx(auVar21,auVar20);
      auVar35._0_4_ = auVar21._0_4_ + auVar20._0_4_;
      auVar35._4_4_ = auVar21._4_4_ + auVar20._4_4_;
      auVar35._8_4_ = auVar21._8_4_ + auVar20._8_4_;
      auVar35._12_4_ = auVar21._12_4_ + auVar20._12_4_;
      auVar20 = vsubps_avx(auVar27,auVar34);
      auVar28._0_4_ = auVar27._0_4_ + auVar34._0_4_;
      auVar28._4_4_ = auVar27._4_4_ + auVar34._4_4_;
      auVar28._8_4_ = auVar27._8_4_ + auVar34._8_4_;
      auVar28._12_4_ = auVar27._12_4_ + auVar34._12_4_;
      auVar34 = vsubps_avx(auVar33,auVar40);
      auVar21._0_4_ = auVar33._0_4_ + auVar40._0_4_;
      auVar21._4_4_ = auVar33._4_4_ + auVar40._4_4_;
      auVar21._8_4_ = auVar33._8_4_ + auVar40._8_4_;
      auVar21._12_4_ = auVar33._12_4_ + auVar40._12_4_;
      auVar59._0_4_ = auVar34._0_4_ * auVar28._0_4_;
      auVar59._4_4_ = auVar34._4_4_ * auVar28._4_4_;
      auVar59._8_4_ = auVar34._8_4_ * auVar28._8_4_;
      auVar59._12_4_ = auVar34._12_4_ * auVar28._12_4_;
      auVar27 = vfmsub231ps_fma(auVar59,auVar20,auVar21);
      auVar54._0_4_ = auVar21._0_4_ * auVar22._0_4_;
      auVar54._4_4_ = auVar21._4_4_ * auVar22._4_4_;
      auVar54._8_4_ = auVar21._8_4_ * auVar22._8_4_;
      auVar54._12_4_ = auVar21._12_4_ * auVar22._12_4_;
      auVar21 = vfmsub231ps_fma(auVar54,auVar34,auVar35);
      auVar36._0_4_ = auVar20._0_4_ * auVar35._0_4_;
      auVar36._4_4_ = auVar20._4_4_ * auVar35._4_4_;
      auVar36._8_4_ = auVar20._8_4_ * auVar35._8_4_;
      auVar36._12_4_ = auVar20._12_4_ * auVar35._12_4_;
      auVar33 = vfmsub231ps_fma(auVar36,auVar22,auVar28);
      local_b80._0_4_ = local_b80._4_4_;
      fStack_b78 = local_b80._4_4_;
      fStack_b74 = local_b80._4_4_;
      auVar29._0_4_ = auVar33._0_4_ * local_b80._4_4_;
      auVar29._4_4_ = auVar33._4_4_ * local_b80._4_4_;
      auVar29._8_4_ = auVar33._8_4_ * local_b80._4_4_;
      auVar29._12_4_ = auVar33._12_4_ * local_b80._4_4_;
      auVar21 = vfmadd231ps_fma(auVar29,auVar86,auVar21);
      auVar33 = vfmadd231ps_fma(auVar21,local_be0,auVar27);
      local_9f0 = local_a10._0_4_;
      fStack_9ec = local_a10._4_4_;
      fStack_9e8 = local_a10._8_4_;
      fStack_9e4 = local_a10._12_4_;
      local_9d0._0_4_ = auVar33._0_4_ + local_9f0 + local_9e0._0_4_;
      local_9d0._4_4_ = auVar33._4_4_ + fStack_9ec + local_9e0._4_4_;
      local_9d0._8_4_ = auVar33._8_4_ + fStack_9e8 + local_9e0._8_4_;
      local_9d0._12_4_ = auVar33._12_4_ + fStack_9e4 + local_9e0._12_4_;
      auVar37._8_4_ = 0x7fffffff;
      auVar37._0_8_ = 0x7fffffff7fffffff;
      auVar37._12_4_ = 0x7fffffff;
      auVar21 = vminps_avx(local_a10,local_9e0);
      auVar21 = vminps_avx(auVar21,auVar33);
      local_a20 = vandps_avx(local_9d0,auVar37);
      auVar69._0_4_ = local_a20._0_4_ * 1.1920929e-07;
      auVar69._4_4_ = local_a20._4_4_ * 1.1920929e-07;
      auVar69._8_4_ = local_a20._8_4_ * 1.1920929e-07;
      auVar69._12_4_ = local_a20._12_4_ * 1.1920929e-07;
      uVar8 = CONCAT44(auVar69._4_4_,auVar69._0_4_);
      auVar60._0_8_ = uVar8 ^ 0x8000000080000000;
      auVar60._8_4_ = -auVar69._8_4_;
      auVar60._12_4_ = -auVar69._12_4_;
      auVar21 = vcmpps_avx(auVar21,auVar60,5);
      auVar27 = vmaxps_avx(local_a10,local_9e0);
      auVar27 = vmaxps_avx(auVar27,auVar33);
      auVar27 = vcmpps_avx(auVar27,auVar69,2);
      auVar21 = vorps_avx(auVar21,auVar27);
      if ((((auVar21 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar21 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar21 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar21[0xf] < '\0'
         ) {
        auVar30._0_4_ = local_bb0._0_4_ * fVar71;
        auVar30._4_4_ = local_bb0._4_4_ * fVar78;
        auVar30._8_4_ = local_bb0._8_4_ * fVar82;
        auVar30._12_4_ = local_bb0._12_4_ * fVar87;
        auVar55._0_4_ = fVar81 * local_bc0._0_4_;
        auVar55._4_4_ = fVar73 * local_bc0._4_4_;
        auVar55._8_4_ = fVar80 * local_bc0._8_4_;
        auVar55._12_4_ = fVar84 * local_bc0._12_4_;
        auVar40 = vfmsub213ps_fma(local_bc0,local_a00,auVar30);
        auVar61._0_4_ = auVar20._0_4_ * fVar74;
        auVar61._4_4_ = auVar20._4_4_ * fVar72;
        auVar61._8_4_ = auVar20._8_4_ * fVar79;
        auVar61._12_4_ = auVar20._12_4_ * fVar83;
        auVar70._0_4_ = fVar81 * auVar34._0_4_;
        auVar70._4_4_ = fVar73 * auVar34._4_4_;
        auVar70._8_4_ = fVar80 * auVar34._8_4_;
        auVar70._12_4_ = fVar84 * auVar34._12_4_;
        auVar34 = vfmsub213ps_fma(auVar34,auVar41,auVar61);
        auVar27 = vandps_avx(auVar30,auVar37);
        auVar33 = vandps_avx(auVar61,auVar37);
        auVar27 = vcmpps_avx(auVar27,auVar33,1);
        local_970 = vblendvps_avx(auVar34,auVar40,auVar27);
        auVar62._0_4_ = auVar22._0_4_ * fVar71;
        auVar62._4_4_ = auVar22._4_4_ * fVar78;
        auVar62._8_4_ = auVar22._8_4_ * fVar82;
        auVar62._12_4_ = auVar22._12_4_ * fVar87;
        auVar34 = vfmsub213ps_fma(auVar22,local_a00,auVar70);
        auVar31._0_4_ = local_ba0._0_4_ * fVar74;
        auVar31._4_4_ = local_ba0._4_4_ * fVar72;
        auVar31._8_4_ = local_ba0._8_4_ * fVar79;
        auVar31._12_4_ = local_ba0._12_4_ * fVar83;
        auVar40 = vfmsub213ps_fma(local_bb0,auVar45,auVar31);
        auVar27 = vandps_avx(auVar31,auVar37);
        auVar33 = vandps_avx(auVar70,auVar37);
        auVar27 = vcmpps_avx(auVar27,auVar33,1);
        local_960 = vblendvps_avx(auVar34,auVar40,auVar27);
        auVar34 = vfmsub213ps_fma(local_ba0,auVar41,auVar55);
        auVar20 = vfmsub213ps_fma(auVar20,auVar45,auVar62);
        auVar27 = vandps_avx(auVar55,auVar37);
        auVar33 = vandps_avx(auVar62,auVar37);
        auVar27 = vcmpps_avx(auVar27,auVar33,1);
        local_950 = vblendvps_avx(auVar20,auVar34,auVar27);
        auVar52._0_4_ = local_950._0_4_ * local_b80._4_4_;
        auVar52._4_4_ = local_950._4_4_ * local_b80._4_4_;
        auVar52._8_4_ = local_950._8_4_ * local_b80._4_4_;
        auVar52._12_4_ = local_950._12_4_ * local_b80._4_4_;
        auVar27 = vfmadd213ps_fma(auVar86,local_960,auVar52);
        auVar27 = vfmadd213ps_fma(local_be0,local_970,auVar27);
        auVar56._0_4_ = auVar27._0_4_ + auVar27._0_4_;
        auVar56._4_4_ = auVar27._4_4_ + auVar27._4_4_;
        auVar56._8_4_ = auVar27._8_4_ + auVar27._8_4_;
        auVar56._12_4_ = auVar27._12_4_ + auVar27._12_4_;
        auVar53._0_4_ = local_950._0_4_ * fVar85;
        auVar53._4_4_ = local_950._4_4_ * fVar90;
        auVar53._8_4_ = local_950._8_4_ * fVar94;
        auVar53._12_4_ = local_950._12_4_ * fVar66;
        auVar27 = vfmadd213ps_fma(local_b70,local_960,auVar53);
        auVar33 = vfmadd213ps_fma(local_b60,local_970,auVar27);
        auVar27 = vrcpps_avx(auVar56);
        auVar76._8_4_ = 0x3f800000;
        auVar76._0_8_ = 0x3f8000003f800000;
        auVar76._12_4_ = 0x3f800000;
        auVar20 = vfnmadd213ps_fma(auVar27,auVar56,auVar76);
        auVar27 = vfmadd132ps_fma(auVar20,auVar27,auVar27);
        local_980._0_4_ = auVar27._0_4_ * (auVar33._0_4_ + auVar33._0_4_);
        local_980._4_4_ = auVar27._4_4_ * (auVar33._4_4_ + auVar33._4_4_);
        local_980._8_4_ = auVar27._8_4_ * (auVar33._8_4_ + auVar33._8_4_);
        local_980._12_4_ = auVar27._12_4_ * (auVar33._12_4_ + auVar33._12_4_);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
        auVar63._4_4_ = uVar1;
        auVar63._0_4_ = uVar1;
        auVar63._8_4_ = uVar1;
        auVar63._12_4_ = uVar1;
        auVar27 = vcmpps_avx(auVar63,local_980,2);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar77._4_4_ = uVar1;
        auVar77._0_4_ = uVar1;
        auVar77._8_4_ = uVar1;
        auVar77._12_4_ = uVar1;
        auVar57 = ZEXT1664(auVar77);
        auVar33 = vcmpps_avx(local_980,auVar77,2);
        auVar27 = vandps_avx(auVar33,auVar27);
        auVar33 = auVar21 & auVar27;
        if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar33[0xf] < '\0') {
          auVar21 = vandps_avx(auVar21,auVar27);
          auVar27 = vcmpps_avx(auVar56,_DAT_01f45a50,4);
          local_9b0 = vandps_avx(auVar21,auVar27);
          uVar9 = vmovmskps_avx(local_9b0);
          if (uVar9 != 0) {
            lVar10 = lVar10 + uVar18;
            uStack_be8 = auVar86._8_8_;
            local_bf0 = lVar10;
            local_9c0 = &local_bf9;
            auVar21 = vrcpps_avx(local_9d0);
            auVar38._8_4_ = 0x3f800000;
            auVar38._0_8_ = 0x3f8000003f800000;
            auVar38._12_4_ = 0x3f800000;
            auVar27 = vfnmadd213ps_fma(local_9d0,auVar21,auVar38);
            auVar27 = vfmadd132ps_fma(auVar27,auVar21,auVar21);
            auVar32._8_4_ = 0x219392ef;
            auVar32._0_8_ = 0x219392ef219392ef;
            auVar32._12_4_ = 0x219392ef;
            auVar21 = vcmpps_avx(local_a20,auVar32,5);
            auVar21 = vandps_avx(auVar21,auVar27);
            auVar24._0_4_ = local_9f0 * auVar21._0_4_;
            auVar24._4_4_ = fStack_9ec * auVar21._4_4_;
            auVar24._8_4_ = fStack_9e8 * auVar21._8_4_;
            auVar24._12_4_ = fStack_9e4 * auVar21._12_4_;
            local_9a0 = vminps_avx(auVar24,auVar38);
            auVar25._0_4_ = auVar21._0_4_ * local_9e0._0_4_;
            auVar25._4_4_ = auVar21._4_4_ * local_9e0._4_4_;
            auVar25._8_4_ = auVar21._8_4_ * local_9e0._8_4_;
            auVar25._12_4_ = auVar21._12_4_ * local_9e0._12_4_;
            local_990 = vminps_avx(auVar25,auVar38);
            uVar8 = (ulong)(uVar9 & 0xff);
            local_b80 = context->scene;
            pSVar15 = context->scene;
            do {
              uVar13 = 0;
              for (uVar6 = uVar8; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                uVar13 = uVar13 + 1;
              }
              uVar9 = *(uint *)(lVar10 + 0x120 + uVar13 * 4);
              pGVar12 = (pSVar15->geometries).items[uVar9].ptr;
              if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                local_be0._0_8_ = uVar13;
                local_b60._0_8_ = uVar8;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_b70._0_8_ = pGVar12;
                  uVar8 = (ulong)(uint)((int)uVar13 * 4);
                  local_8c0 = *(undefined4 *)(local_9a0 + uVar8);
                  local_8a0 = *(undefined4 *)(local_990 + uVar8);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_980 + uVar8);
                  local_b30.context = context->user;
                  uVar1 = *(undefined4 *)(local_bf0 + 0x130 + uVar8);
                  local_880._4_4_ = uVar1;
                  local_880._0_4_ = uVar1;
                  local_880._8_4_ = uVar1;
                  local_880._12_4_ = uVar1;
                  local_880._16_4_ = uVar1;
                  local_880._20_4_ = uVar1;
                  local_880._24_4_ = uVar1;
                  local_880._28_4_ = uVar1;
                  uVar1 = *(undefined4 *)(local_970 + uVar8);
                  uVar2 = *(undefined4 *)(local_960 + uVar8);
                  local_900._4_4_ = uVar2;
                  local_900._0_4_ = uVar2;
                  local_900._8_4_ = uVar2;
                  local_900._12_4_ = uVar2;
                  local_900._16_4_ = uVar2;
                  local_900._20_4_ = uVar2;
                  local_900._24_4_ = uVar2;
                  local_900._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_950 + uVar8);
                  local_8e0._4_4_ = uVar2;
                  local_8e0._0_4_ = uVar2;
                  local_8e0._8_4_ = uVar2;
                  local_8e0._12_4_ = uVar2;
                  local_8e0._16_4_ = uVar2;
                  local_8e0._20_4_ = uVar2;
                  local_8e0._24_4_ = uVar2;
                  local_8e0._28_4_ = uVar2;
                  local_860._4_4_ = uVar9;
                  local_860._0_4_ = uVar9;
                  local_860._8_4_ = uVar9;
                  local_860._12_4_ = uVar9;
                  local_860._16_4_ = uVar9;
                  local_860._20_4_ = uVar9;
                  local_860._24_4_ = uVar9;
                  local_860._28_4_ = uVar9;
                  local_920[0] = (RTCHitN)(char)uVar1;
                  local_920[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[4] = (RTCHitN)(char)uVar1;
                  local_920[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[8] = (RTCHitN)(char)uVar1;
                  local_920[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0xc] = (RTCHitN)(char)uVar1;
                  local_920[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0x10] = (RTCHitN)(char)uVar1;
                  local_920[0x11] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0x12] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0x13] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0x14] = (RTCHitN)(char)uVar1;
                  local_920[0x15] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0x16] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0x17] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0x18] = (RTCHitN)(char)uVar1;
                  local_920[0x19] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0x1a] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0x1b] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  local_920[0x1c] = (RTCHitN)(char)uVar1;
                  local_920[0x1d] = (RTCHitN)(char)((uint)uVar1 >> 8);
                  local_920[0x1e] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
                  local_920[0x1f] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
                  uStack_8bc = local_8c0;
                  uStack_8b8 = local_8c0;
                  uStack_8b4 = local_8c0;
                  uStack_8b0 = local_8c0;
                  uStack_8ac = local_8c0;
                  uStack_8a8 = local_8c0;
                  uStack_8a4 = local_8c0;
                  uStack_89c = local_8a0;
                  uStack_898 = local_8a0;
                  uStack_894 = local_8a0;
                  uStack_890 = local_8a0;
                  uStack_88c = local_8a0;
                  uStack_888 = local_8a0;
                  uStack_884 = local_8a0;
                  auVar26 = vpcmpeqd_avx2(local_860,local_860);
                  uStack_83c = (local_b30.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_b30.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_b00 = local_940;
                  local_b30.valid = (int *)local_b00;
                  local_b30.geometryUserPtr = pGVar12->userPtr;
                  local_b30.hit = local_920;
                  local_b30.N = 8;
                  local_b30.ray = (RTCRayN *)ray;
                  if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_ba0._0_8_ = k;
                    local_b90._0_8_ = ray;
                    local_bb0._0_8_ = puVar14;
                    local_bc0._0_8_ = uVar16;
                    local_bd0 = auVar57._0_16_;
                    auVar26 = ZEXT1632(auVar26._0_16_);
                    (*pGVar12->occlusionFilterN)(&local_b30);
                    auVar57 = ZEXT1664(local_bd0);
                    auVar26 = vpcmpeqd_avx2(auVar26,auVar26);
                    k = local_ba0._0_8_;
                    pGVar12 = (Geometry *)local_b70._0_8_;
                    puVar14 = (ulong *)local_bb0._0_8_;
                    ray = (RayK<8> *)local_b90._0_8_;
                    uVar16 = local_bc0._0_8_;
                  }
                  auVar4 = vpcmpeqd_avx2(local_b00,_DAT_01f7b000);
                  auVar5 = auVar26 & ~auVar4;
                  if ((((((((auVar5 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar5 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar5 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar5 >> 0x7f,0) == '\0') &&
                        (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar5 >> 0xbf,0) == '\0') &&
                      (auVar5 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar5[0x1f]) {
                    auVar4 = auVar4 ^ auVar26;
                  }
                  else {
                    p_Var3 = context->args->filter;
                    if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                      local_ba0._0_8_ = k;
                      local_b90._0_8_ = ray;
                      local_bb0._0_8_ = puVar14;
                      local_bc0._0_8_ = uVar16;
                      local_bd0 = auVar57._0_16_;
                      auVar26 = ZEXT1632(auVar26._0_16_);
                      (*p_Var3)(&local_b30);
                      auVar57 = ZEXT1664(local_bd0);
                      auVar26 = vpcmpeqd_avx2(auVar26,auVar26);
                      k = local_ba0._0_8_;
                      puVar14 = (ulong *)local_bb0._0_8_;
                      ray = (RayK<8> *)local_b90._0_8_;
                      uVar16 = local_bc0._0_8_;
                    }
                    auVar5 = vpcmpeqd_avx2(local_b00,_DAT_01f7b000);
                    auVar4 = auVar5 ^ auVar26;
                    auVar39._8_4_ = 0xff800000;
                    auVar39._0_8_ = 0xff800000ff800000;
                    auVar39._12_4_ = 0xff800000;
                    auVar39._16_4_ = 0xff800000;
                    auVar39._20_4_ = 0xff800000;
                    auVar39._24_4_ = 0xff800000;
                    auVar39._28_4_ = 0xff800000;
                    auVar26 = vblendvps_avx(auVar39,*(undefined1 (*) [32])(local_b30.ray + 0x100),
                                            auVar5);
                    *(undefined1 (*) [32])(local_b30.ray + 0x100) = auVar26;
                  }
                  if ((((((((auVar4 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar4 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar4 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar4 >> 0x7f,0) == '\0') &&
                        (auVar4 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar4 >> 0xbf,0) == '\0') &&
                      (auVar4 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar4[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = auVar57._0_4_;
                    uVar8 = local_b60._0_8_ ^ 1L << (local_be0._0_8_ & 0x3f);
                    lVar10 = local_bf0;
                    goto LAB_015f20f9;
                  }
                }
                *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                goto LAB_015f2271;
              }
              uVar8 = uVar8 ^ 1L << (uVar13 & 0x3f);
              lVar10 = local_bf0;
LAB_015f20f9:
              pSVar15 = local_b80;
            } while (uVar8 != 0);
          }
        }
      }
      auVar57 = ZEXT1664(local_a30);
      auVar64 = ZEXT1664(local_a40);
      auVar65 = ZEXT1664(local_a50);
      auVar101 = ZEXT1664(local_ac0);
      auVar102 = ZEXT1664(local_ad0);
      fVar66 = local_a60;
      fVar71 = fStack_a5c;
      fVar72 = fStack_a58;
      fVar73 = fStack_a54;
      fVar74 = local_a70;
      fVar78 = fStack_a6c;
      fVar79 = fStack_a68;
      fVar80 = fStack_a64;
      fVar81 = local_a80;
      fVar82 = fStack_a7c;
      fVar83 = fStack_a78;
      fVar84 = fStack_a74;
      fVar85 = local_a90;
      fVar87 = fStack_a8c;
      fVar88 = fStack_a88;
      fVar89 = fStack_a84;
      fVar90 = local_aa0;
      fVar91 = fStack_a9c;
      fVar92 = fStack_a98;
      fVar93 = fStack_a94;
      fVar94 = local_ab0;
      fVar97 = fStack_aac;
      fVar98 = fStack_aa8;
      fVar99 = fStack_aa4;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }